

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O0

void gb_update_wave_channel(gb_sound_t *gb,SOUND *snd,UINT32 cycles)

{
  INT8 local_2c;
  UINT32 cycles_local;
  SOUND *snd_local;
  gb_sound_t *gb_local;
  
  if ((snd->on & 1U) != 0) {
    snd->cycles_left = cycles + snd->cycles_left;
    while (1 < snd->cycles_left) {
      snd->cycles_left = snd->cycles_left + -2;
      snd->frequency_counter = snd->frequency_counter + 1 & 0x7ff;
      snd->sample_reading = false;
      if ((gb->gbMode == '\0') && (snd->frequency_counter == 0x7ff)) {
        snd->offset = snd->offset + 1 & 0x1f;
      }
      if (snd->frequency_counter == 0) {
        snd->sample_reading = true;
        if (gb->gbMode == '\x01') {
          snd->offset = snd->offset + 1 & 0x1f;
        }
        snd->current_sample = gb->snd_regs[(int)(snd->offset / 2 + 0x20)];
        if ((snd->offset & 1) == 0) {
          snd->current_sample = snd->current_sample >> 4;
        }
        snd->current_sample = (snd->current_sample & 0xfU) - 8;
        if (gb->BoostWaveChn != '\0') {
          snd->current_sample = snd->current_sample << 1;
        }
        if (snd->level == '\0') {
          local_2c = '\0';
        }
        else {
          local_2c = (INT8)((int)snd->current_sample / (1 << (snd->level - 1 & 0x1f)));
        }
        snd->signal = local_2c;
        snd->frequency_counter = snd->frequency;
      }
    }
  }
  return;
}

Assistant:

static void gb_update_wave_channel(gb_sound_t *gb, struct SOUND *snd, UINT32 cycles)
{
	if (snd->on)
	{
		// compensate for leftover cycles
		snd->cycles_left += cycles;

		while (snd->cycles_left >= 2)
		{
			snd->cycles_left -= 2;

			// Calculate next state
			snd->frequency_counter = (snd->frequency_counter + 1) & 0x7ff;
			snd->sample_reading = false;
			if (gb->gbMode == GBMODE_DMG && snd->frequency_counter == 0x7ff)
				snd->offset = (snd->offset + 1) & 0x1F;
			if (snd->frequency_counter == 0)
			{
				// Read next sample
				snd->sample_reading = true;
				if (gb->gbMode == GBMODE_CGB04)
					snd->offset = (snd->offset + 1) & 0x1f;
				snd->current_sample = gb->snd_regs[AUD3W0 + (snd->offset/2)];
				if (!(snd->offset & 0x01))
				{
					snd->current_sample >>= 4;
				}
				snd->current_sample = (snd->current_sample & 0x0f) - 8;
				if (gb->BoostWaveChn)
					snd->current_sample <<= 1;

				snd->signal = snd->level ? snd->current_sample / (1 << (snd->level - 1)) : 0;

				// Reload frequency counter
				snd->frequency_counter = snd->frequency;
			}
		}
	}
}